

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim.h
# Opt level: O2

void __thiscall aiNodeAnim::~aiNodeAnim(aiNodeAnim *this)

{
  if (this->mPositionKeys != (aiVectorKey *)0x0) {
    operator_delete__(this->mPositionKeys);
  }
  if (this->mRotationKeys != (aiQuatKey *)0x0) {
    operator_delete__(this->mRotationKeys);
  }
  if (this->mScalingKeys != (aiVectorKey *)0x0) {
    operator_delete__(this->mScalingKeys);
    return;
  }
  return;
}

Assistant:

~aiNodeAnim() {
        delete [] mPositionKeys;
        delete [] mRotationKeys;
        delete [] mScalingKeys;
    }